

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmParsePHPCoverage.cxx
# Opt level: O1

bool __thiscall cmParsePHPCoverage::ReadPHPCoverageDirectory(cmParsePHPCoverage *this,char *d)

{
  bool bVar1;
  int iVar2;
  Status SVar3;
  unsigned_long uVar4;
  char *pcVar5;
  unsigned_long dindex;
  ulong uVar6;
  bool bVar7;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  Directory dir;
  string file;
  string path;
  Directory DStack_e8;
  string local_e0;
  string local_c0;
  size_type local_a0;
  pointer local_98;
  cmParsePHPCoverage *local_90;
  char *local_88;
  string local_80;
  undefined8 local_60;
  undefined1 *local_58;
  undefined1 local_50 [32];
  
  local_90 = this;
  cmsys::Directory::Directory(&DStack_e8);
  local_88 = d;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,d,(allocator<char> *)&local_60);
  SVar3 = cmsys::Directory::Load(&DStack_e8,&local_c0,(string *)0x0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  if (SVar3.Kind_ == Success) {
    uVar4 = cmsys::Directory::GetNumberOfFiles(&DStack_e8);
    bVar7 = uVar4 == 0;
    if (!bVar7) {
      dindex = 0;
      uVar6 = 1;
      do {
        pcVar5 = cmsys::Directory::GetFile(&DStack_e8,dindex);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_e0,pcVar5,(allocator<char> *)&local_c0);
        iVar2 = std::__cxx11::string::compare((char *)&local_e0);
        if (iVar2 != 0) {
          iVar2 = std::__cxx11::string::compare((char *)&local_e0);
          if (iVar2 != 0) {
            bVar7 = cmsys::SystemTools::FileIsDirectory(&local_e0);
            pcVar5 = local_88;
            if (!bVar7) {
              local_c0._M_dataplus._M_p = (pointer)strlen(local_88);
              local_60 = 1;
              local_c0.field_2._8_8_ = local_50;
              local_50[0] = 0x2f;
              local_c0._M_string_length = (size_type)pcVar5;
              local_c0.field_2._M_allocated_capacity = 1;
              local_a0 = local_e0._M_string_length;
              local_98 = local_e0._M_dataplus._M_p;
              views._M_len = 3;
              views._M_array = (iterator)&local_c0;
              local_58 = (undefined1 *)local_c0.field_2._8_8_;
              cmCatViews_abi_cxx11_(&local_80,views);
              bVar7 = ReadPHPData(local_90,local_80._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_80._M_dataplus._M_p != &local_80.field_2) {
                operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1
                               );
              }
              if (!bVar7) {
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
                  operator_delete(local_e0._M_dataplus._M_p,
                                  local_e0.field_2._M_allocated_capacity + 1);
                }
                goto LAB_001a3e74;
              }
            }
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
          operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
        }
        bVar7 = uVar4 <= uVar6;
        bVar1 = uVar6 < uVar4;
        dindex = uVar6;
        uVar6 = (ulong)((int)uVar6 + 1);
      } while (bVar1);
    }
  }
  else {
LAB_001a3e74:
    bVar7 = false;
  }
  cmsys::Directory::~Directory(&DStack_e8);
  return bVar7;
}

Assistant:

bool cmParsePHPCoverage::ReadPHPCoverageDirectory(const char* d)
{
  cmsys::Directory dir;
  if (!dir.Load(d)) {
    return false;
  }
  size_t numf;
  unsigned int i;
  numf = dir.GetNumberOfFiles();
  for (i = 0; i < numf; i++) {
    std::string file = dir.GetFile(i);
    if (file != "." && file != ".." && !cmSystemTools::FileIsDirectory(file)) {
      std::string path = cmStrCat(d, '/', file);
      if (!this->ReadPHPData(path.c_str())) {
        return false;
      }
    }
  }
  return true;
}